

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recalc.cpp
# Opt level: O1

void __thiscall Simplex::checkBasis(Simplex *this)

{
  longdouble *a;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  longdouble lVar4;
  
  fwrite("Check basis:\n",0xd,1,_stderr);
  lVar3 = (long)this->m;
  uVar1 = 0xffffffffffffffff;
  if (-1 < lVar3) {
    uVar1 = lVar3 << 4;
  }
  a = (longdouble *)operator_new__(uVar1);
  if (0 < lVar3) {
    uVar1 = 0;
    do {
      calcBInvRow(this,a,(int)uVar1);
      if (0 < this->m) {
        uVar2 = 0;
        do {
          lVar4 = (longdouble)0;
          if (0 < (long)this->AV_nz[this->rtoc[uVar2]]) {
            lVar3 = 0;
            do {
              lVar4 = *(longdouble *)((long)&this->AV[this->rtoc[uVar2]]->field_0 + lVar3) *
                      a[*(int *)((long)&this->AV[this->rtoc[uVar2]]->field_0 + lVar3 + 0xc)] + lVar4
              ;
              lVar3 = lVar3 + 0x10;
            } while ((long)this->AV_nz[this->rtoc[uVar2]] * 0x10 != lVar3);
          }
          if (uVar1 == uVar2) {
            lVar4 = lVar4 + -(longdouble)1;
          }
          if ((longdouble)1e-06 <= ABS(lVar4)) {
            fprintf(_stderr,"%d:%d:%.2Lf ",uVar1 & 0xffffffff,uVar2 & 0xffffffff,in_R8,in_R9,lVar4);
          }
          uVar2 = uVar2 + 1;
        } while ((long)uVar2 < (long)this->m);
      }
      uVar1 = uVar1 + 1;
    } while ((long)uVar1 < (long)this->m);
  }
  operator_delete__(a);
  return;
}

Assistant:

void Simplex::checkBasis() {
	//	printTableau(true);
	fprintf(stderr, "Check basis:\n");
	//	long double temp[m];
	auto* temp = new long double[m];
	for (int i = 0; i < m; i++) {
		calcBInvRow(temp, i);
		for (int j = 0; j < m; j++) {
			long double sum = 0;
			for (int k = 0; k < AV_nz[rtoc[j]]; k++) {
				sum += temp[AV[rtoc[j]][k].index()] * AV[rtoc[j]][k].val();
			}
			if (i == j) {
				sum -= 1;
			}
			if (!almostZero6(sum)) {
				fprintf(stderr, "%d:%d:%.2Lf ", i, j, sum);
			}
			assert(almostZero6(sum));
		}
		//		fprintf(stderr, "\n");
	}
	delete[] temp;
}